

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderBuiltinFunctionTests::init
          (ShaderBuiltinFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestCaseGroup *node;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderCommonFunctionTests::ShaderCommonFunctionTests
            ((ShaderCommonFunctionTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderPackingFunctionTests::ShaderPackingFunctionTests
            ((ShaderPackingFunctionTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderIntegerFunctionTests::ShaderIntegerFunctionTests
            ((ShaderIntegerFunctionTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderTextureSizeTests::ShaderTextureSizeTests
            ((ShaderTextureSizeTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  node = createBuiltinPrecisionTests((this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)node);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new ShaderCommonFunctionTests	(m_context));
		addChild(new ShaderPackingFunctionTests	(m_context));
		addChild(new ShaderIntegerFunctionTests	(m_context));
		addChild(new ShaderTextureSizeTests		(m_context));
		addChild(createBuiltinPrecisionTests	(m_context));
	}